

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O2

void __thiscall
Address_ElementsInvalidAddressTest_Test::TestBody(Address_ElementsInvalidAddressTest_Test *this)

{
  bool bVar1;
  allocator local_4c9;
  string local_4c8;
  ByteData160 hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_490;
  Address local_478;
  Address local_300;
  Address local_188;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_4c8,"C76uVp7JJqeUKht3wQXajaaGvUJAfEDnPx",(allocator *)&local_490);
    cfd::core::GetElementsAddressFormatList();
    cfd::core::Address::Address
              (&local_188,&local_4c8,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)&hash);
    cfd::core::Address::~Address(&local_188);
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &hash);
    std::__cxx11::string::~string((string *)&local_4c8);
  }
  testing::Message::Message((Message *)&local_4c8);
  std::operator<<((ostream *)(local_4c8._M_dataplus._M_p + 0x10),"pref");
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&hash,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
             ,0x3f5,
             "Expected: Address(\"C76uVp7JJqeUKht3wQXajaaGvUJAfEDnPx\", GetElementsAddressFormatList()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&hash,(Message *)&local_4c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&hash);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_4c8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_4c8,"DbJDuZXuDVSiYB6QXb5fn",(allocator *)&local_490);
    cfd::core::GetElementsAddressFormatList();
    cfd::core::Address::Address
              (&local_300,&local_4c8,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)&hash);
    cfd::core::Address::~Address(&local_300);
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &hash);
    std::__cxx11::string::~string((string *)&local_4c8);
  }
  testing::Message::Message((Message *)&local_4c8);
  std::operator<<((ostream *)(local_4c8._M_dataplus._M_p + 0x10),"len");
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&hash,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
             ,0x3f7,
             "Expected: Address(\"DbJDuZXuDVSiYB6QXb5fn\", GetElementsAddressFormatList()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&hash,(Message *)&local_4c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&hash);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_4c8);
  std::__cxx11::string::string
            ((string *)&local_4c8,
             "02d21c625759280111907a06df050cccbc875b11a50bdafa71dae5d1e8695ba82e",&local_4c9);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_490,&local_4c8);
  cfd::core::HashUtil::Hash160(&hash,(Pubkey *)&local_490);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_490);
  std::__cxx11::string::~string((string *)&local_4c8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::GetElementsAddressFormatList();
    cfd::core::Address::Address
              (&local_478,kCfdConnectionError,kP2pkhAddress,&hash,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)&local_4c8);
    cfd::core::Address::~Address(&local_478);
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &local_4c8);
  }
  testing::Message::Message((Message *)&local_4c8);
  std::operator<<((ostream *)(local_4c8._M_dataplus._M_p + 0x10),"net");
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_490,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
             ,0x3fe,
             "Expected: Address(ElementsNetType::kNetTypeNum, ElementsAddressType::kP2pkhAddress, hash, GetElementsAddressFormatList()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_490,(Message *)&local_4c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_490);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_4c8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
  return;
}

Assistant:

TEST(Address, ElementsInvalidAddressTest) {
  // invalid address prefix [base58(01 + pubkey hash)]
  EXPECT_THROW(Address("C76uVp7JJqeUKht3wQXajaaGvUJAfEDnPx", GetElementsAddressFormatList()),
      CfdException)<< "pref";
  // invalid data (decode error)
  EXPECT_THROW(Address("DbJDuZXuDVSiYB6QXb5fn", GetElementsAddressFormatList()), CfdException)<< "len";

  ByteData160 hash =
      HashUtil::Hash160(
          Pubkey(
              "02d21c625759280111907a06df050cccbc875b11a50bdafa71dae5d1e8695ba82e"));
  // invalid net type
  EXPECT_THROW(Address(ElementsNetType::kNetTypeNum, ElementsAddressType::kP2pkhAddress, hash, GetElementsAddressFormatList()), CfdException)<< "net";
}